

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O1

void __thiscall BMRS<UFPC>::SecondScan(BMRS<UFPC> *this)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Mat1i *pMVar5;
  uint64_t *puVar6;
  long lVar7;
  uint *puVar8;
  Run *pRVar9;
  Run *pRVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ushort uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar2 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pRVar10 = (this->data_runs).runs;
  if (1 < (int)uVar2) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar6 = (this->data_compressed).bits;
    lVar15 = *(long *)&pMVar5->field_0x10;
    lVar7 = **(long **)&pMVar5->field_0x48;
    lVar16 = lVar15 + lVar7;
    lVar7 = lVar7 * 2;
    uVar17 = 0;
    pRVar9 = pRVar10;
    do {
      puVar8 = UFPC::P_;
      iVar3 = (this->data_compressed).data_width;
      iVar13 = (int)uVar17 * iVar3;
      do {
        uVar14 = pRVar9->start_pos;
        uVar11 = (ulong)uVar14;
        if (uVar11 == 0xffff) {
          pRVar10 = pRVar9 + 1;
        }
        else {
          uVar1 = pRVar9->end_pos;
          pRVar10 = pRVar9;
          if (uVar14 < uVar1) {
            uVar4 = puVar8[pRVar9->label];
            do {
              uVar12 = uVar11 >> 6 & 0x3ffffff;
              if ((puVar6[(long)(iVar13 * 2) + uVar12] >> (uVar11 & 0x3f) & 1) != 0) {
                *(uint *)(lVar15 + uVar11 * 4) = uVar4;
              }
              if ((puVar6[(long)(iVar13 * 2) + (long)iVar3 + uVar12] & 1L << ((byte)uVar11 & 0x3f))
                  != 0) {
                *(uint *)(lVar16 + uVar11 * 4) = uVar4;
              }
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
          }
        }
        pRVar9 = pRVar10 + 1;
      } while (uVar14 != 0xffff);
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + lVar7;
      lVar15 = lVar15 + lVar7;
      pRVar9 = pRVar10;
    } while (uVar17 != uVar2 >> 1);
  }
  puVar8 = UFPC::P_;
  if ((uVar2 & 1) != 0) {
    uVar14 = pRVar10->start_pos;
    bVar18 = uVar14 == 0xffff;
    if (!bVar18) {
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar16 = **(long **)&pMVar5->field_0x48;
      lVar15 = *(long *)&pMVar5->field_0x10;
      do {
        uVar1 = pRVar10->end_pos;
        if (uVar14 < uVar1) {
          uVar4 = puVar8[pRVar10->label];
          uVar17 = (ulong)uVar14;
          do {
            *(uint *)((int)(uVar2 - 1) * lVar16 + lVar15 + uVar17 * 4) = uVar4;
            uVar17 = uVar17 + 1;
          } while (uVar1 != uVar17);
        }
        if (bVar18) {
          return;
        }
        uVar14 = pRVar10[1].start_pos;
        pRVar10 = pRVar10 + 1;
        bVar18 = uVar14 == 0xffff;
      } while (!bVar18);
    }
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }
    }